

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_traverse_flatten
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  plutovg_point_t pVar1;
  undefined8 uVar2;
  int iVar3;
  plutovg_path_command_t pVar4;
  plutovg_path_element_t *ppVar5;
  long lVar6;
  anon_struct_8_2_c2b912b6_for_header *paVar7;
  plutovg_path_element_t *ppVar8;
  int iVar9;
  plutovg_path_command_t pVar10;
  int iVar11;
  float fVar12;
  undefined8 uVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  plutovg_point_t points [3];
  anon_struct_8_2_c2b912b6_for_header local_468;
  plutovg_path_element_t pStack_460;
  undefined8 local_458 [2];
  plutovg_path_element_t *local_448;
  plutovg_point_t local_440;
  anon_struct_8_2_c2b912b6_for_header local_438 [2];
  plutovg_path_element_t pStack_428;
  undefined8 local_420;
  undefined8 auStack_418 [125];
  
  if (path->num_curves == 0) {
    plutovg_path_traverse(path,traverse_func,closure);
    return;
  }
  iVar3 = (path->elements).size;
  if (0 < iVar3) {
    ppVar8 = (path->elements).data;
    pVar10 = PLUTOVG_PATH_COMMAND_MOVE_TO;
    iVar11 = 0;
    iVar9 = 0;
    local_448 = ppVar8;
    do {
      ppVar5 = ppVar8 + iVar9;
      pVar4 = (ppVar5->header).command;
      lVar6 = 8;
      paVar7 = &local_468;
      if ((pVar4 < PLUTOVG_PATH_COMMAND_CUBIC_TO) ||
         (paVar7 = &local_468, pVar4 == PLUTOVG_PATH_COMMAND_CLOSE)) {
LAB_0012affb:
        *paVar7 = (anon_struct_8_2_c2b912b6_for_header)*(undefined8 *)((long)ppVar5 + lVar6);
      }
      else if (pVar4 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_468 = ppVar5[1].header;
        pStack_460 = ppVar5[2];
        lVar6 = 0x18;
        paVar7 = (anon_struct_8_2_c2b912b6_for_header *)local_458;
        goto LAB_0012affb;
      }
      iVar9 = iVar9 + *(int *)((long)ppVar5 + 4);
      if (pVar4 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_0012b016:
        (*traverse_func)(closure,pVar4,(plutovg_point_t *)&local_468,1);
        pVar10 = local_468.command;
        iVar11 = local_468.length;
      }
      else if (pVar4 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_438[0].length = iVar11;
        local_438[0].command = pVar10;
        local_438[1] = local_468;
        pStack_428 = pStack_460;
        local_420 = local_458[0];
        lVar6 = 0;
        paVar7 = &local_468;
        do {
          pVar1 = *(plutovg_point_t *)((long)paVar7 + 0x48);
          uVar2 = *(undefined8 *)((long)&local_438[0].command + lVar6);
          fVar12 = (float)uVar2;
          fVar14 = (float)((ulong)uVar2 >> 0x20);
          fVar17 = pVar1.x - fVar12;
          fVar18 = pVar1.y - fVar14;
          if (ABS(fVar18) + ABS(fVar17) <= 1.0) {
            uVar13 = *(undefined8 *)((long)paVar7 + 0x38);
            uVar15 = *(undefined8 *)((long)paVar7 + 0x40);
            fVar19 = ABS(fVar14 - (float)((ulong)uVar15 >> 0x20)) +
                     ABS(fVar12 - (float)uVar15) +
                     ABS(fVar14 - (float)((ulong)uVar13 >> 0x20)) + ABS(fVar12 - (float)uVar13);
            fVar17 = 0.25;
          }
          else {
            uVar13 = *(undefined8 *)((long)paVar7 + 0x38);
            uVar15 = *(undefined8 *)((long)paVar7 + 0x40);
            fVar19 = ABS(fVar17 * (fVar14 - (float)((ulong)uVar15 >> 0x20)) -
                         fVar18 * (fVar12 - (float)uVar15)) +
                     ABS(fVar17 * (fVar14 - (float)((ulong)uVar13 >> 0x20)) -
                         fVar18 * (fVar12 - (float)uVar13));
            fVar17 = (ABS(fVar18) + ABS(fVar17)) * 0.25;
          }
          if ((lVar6 == 0x3e0) || (fVar19 < fVar17)) {
            local_440 = pVar1;
            (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&local_440,1);
            lVar6 = lVar6 + -0x20;
          }
          else {
            fVar17 = (float)((ulong)uVar13 >> 0x20);
            fVar19 = (fVar12 + (float)uVar13) * 0.5;
            fVar16 = (fVar14 + fVar17) * 0.5;
            fVar18 = (float)((ulong)uVar15 >> 0x20);
            fVar12 = ((float)uVar13 + (float)uVar15) * 0.5;
            fVar14 = (fVar17 + fVar18) * 0.5;
            fVar17 = (pVar1.x + (float)uVar15) * 0.5;
            fVar18 = (pVar1.y + fVar18) * 0.5;
            *(float *)((long)paVar7 + 0x40) = fVar17;
            *(ulong *)((long)auStack_418 + lVar6 + 8) = CONCAT44(fVar16,fVar19);
            fVar19 = (fVar19 + fVar12) * 0.5;
            fVar16 = (fVar16 + fVar14) * 0.5;
            *(float *)((long)paVar7 + 0x44) = fVar18;
            fVar12 = (fVar12 + fVar17) * 0.5;
            fVar17 = (fVar14 + fVar18) * 0.5;
            *(float *)((long)paVar7 + 0x38) = fVar12;
            *(undefined8 *)((long)auStack_418 + lVar6) = uVar2;
            fVar12 = (fVar19 + fVar12) * 0.5;
            fVar14 = (fVar16 + fVar17) * 0.5;
            *(float *)((long)&local_438[0].command + lVar6) = fVar12;
            *(ulong *)((long)auStack_418 + lVar6 + 0x10) = CONCAT44(fVar16,fVar19);
            *(float *)((long)paVar7 + 0x3c) = fVar17;
            *(float *)((long)paVar7 + 0x34) = fVar14;
            *(ulong *)((long)auStack_418 + lVar6 + 0x18) = CONCAT44(fVar14,fVar12);
            lVar6 = lVar6 + 0x20;
          }
          paVar7 = (anon_struct_8_2_c2b912b6_for_header *)((long)&local_468.command + lVar6);
        } while (-1 < lVar6);
        pVar10 = (plutovg_path_command_t)local_458[0];
        iVar11 = (int)((ulong)local_458[0] >> 0x20);
        ppVar8 = local_448;
      }
      else if (pVar4 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_0012b016;
    } while (iVar9 < iVar3);
  }
  return;
}

Assistant:

void plutovg_path_traverse_flatten(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    if(path->num_curves == 0) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    const float threshold = 0.25f;

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    bezier_t beziers[32];
    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    while(plutovg_path_iterator_has_next(&it)) {
        plutovg_path_command_t command = plutovg_path_iterator_next(&it, points);
        switch(command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, command, points, 1);
            current_point = points[0];
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            beziers[0].x1 = current_point.x;
            beziers[0].y1 = current_point.y;
            beziers[0].x2 = points[0].x;
            beziers[0].y2 = points[0].y;
            beziers[0].x3 = points[1].x;
            beziers[0].y3 = points[1].y;
            beziers[0].x4 = points[2].x;
            beziers[0].y4 = points[2].y;
            bezier_t* b = beziers;
            while(b >= beziers) {
                float y4y1 = b->y4 - b->y1;
                float x4x1 = b->x4 - b->x1;
                float l = fabsf(x4x1) + fabsf(y4y1);
                float d;
                if(l > 1.f) {
                    d = fabsf((x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2)) + fabsf((x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3));
                } else {
                    d = fabsf(b->x1 - b->x2) + fabsf(b->y1 - b->y2) + fabsf(b->x1 - b->x3) + fabsf(b->y1 - b->y3);
                    l = 1.f;
                }

                if(d < threshold*l || b == beziers + 31) {
                    plutovg_point_t p = { b->x4, b->y4 };
                    traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
                    --b;
                } else {
                    split_bezier(b, b + 1, b);
                    ++b;
                }
            }

            current_point = points[2];
            break;
        }
    }
}